

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolui.c
# Opt level: O0

int ffgsvui(fitsfile *fptr,int colnum,int naxis,long *naxes,long *blc,long *trc,long *inc,
           unsigned_short nulval,unsigned_short *array,int *anynul,int *status)

{
  long *in_RCX;
  uint in_EDX;
  long *unaff_RBX;
  LONGLONG *unaff_RBP;
  int in_ESI;
  long in_R8;
  long in_R9;
  LONGLONG *unaff_R14;
  int unaff_retaddr;
  fitsfile *in_stack_00000008;
  undefined4 *in_stack_00000020;
  int *in_stack_00000028;
  unsigned_short nullvalue;
  int nullcheck;
  char msg [81];
  char ldummy;
  int anyf;
  int hdutype;
  LONGLONG trcll [9];
  LONGLONG blcll [9];
  LONGLONG dsize [10];
  LONGLONG felem;
  long numcol;
  long ninc;
  long nultyp;
  long nelem;
  long incr [9];
  long stp [9];
  long str [9];
  long rinc;
  long rstp;
  long rstr;
  long row;
  long i8;
  long i7;
  long i6;
  long i5;
  long i4;
  long i3;
  long i2;
  long i1;
  long i0;
  long ii;
  long in_stack_00006f50;
  LONGLONG in_stack_00006f58;
  LONGLONG in_stack_00006f60;
  LONGLONG in_stack_00006f68;
  int in_stack_00006f74;
  fitsfile *in_stack_00006f78;
  int in_stack_00006fc0;
  unsigned_short in_stack_00006fc8;
  unsigned_short *in_stack_00006fd0;
  char *in_stack_00006fd8;
  int *in_stack_00006fe0;
  int *in_stack_00006fe8;
  fitsfile *in_stack_fffffffffffffc98;
  int *in_stack_fffffffffffffca0;
  fitsfile *in_stack_fffffffffffffca8;
  char local_328 [88];
  int local_2d0;
  int local_2cc;
  undefined8 local_2c8 [10];
  undefined8 local_278 [10];
  long alStack_228 [11];
  long local_1d0;
  long local_1c8;
  long local_1c0;
  undefined8 local_1b8;
  long local_1b0;
  long local_1a8 [10];
  long local_158 [10];
  long local_108 [10];
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long *local_38;
  uint local_30;
  int local_2c;
  int in_stack_ffffffffffffffe4;
  int iVar1;
  
  if (((int)in_EDX < 1) || (9 < (int)in_EDX)) {
    snprintf(local_328,0x51,"NAXIS = %d in call to ffgsvui is out of range",(ulong)in_EDX);
    ffpmsg((char *)0x1b7cd6);
    *in_stack_00000028 = 0x140;
    iVar1 = 0x140;
  }
  else {
    local_48 = in_R9;
    local_40 = in_R8;
    local_38 = in_RCX;
    local_30 = in_EDX;
    local_2c = in_ESI;
    iVar1 = fits_is_compressed_image(in_stack_fffffffffffffc98,(int *)0x1b7d09);
    if (iVar1 == 0) {
      iVar1 = ffghdt(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
                     &in_stack_fffffffffffffc98->HDUposition);
      if (iVar1 < 1) {
        if (local_2cc == 0) {
          if (local_2c == 0) {
            local_a8 = 1;
            local_b0 = 1;
          }
          else {
            local_a8 = (long)local_2c;
            local_b0 = (long)local_2c;
          }
          local_b8 = 1;
          local_1c8 = 2;
        }
        else {
          local_a8 = *(long *)(local_40 + (long)(int)local_30 * 8);
          local_b0 = *(long *)(local_48 + (long)(int)local_30 * 8);
          local_b8 = *(long *)(&in_stack_00000008->HDUposition + (long)(int)local_30 * 2);
          local_1c8 = (long)local_2c;
        }
        local_1b8 = 1;
        if (in_stack_00000020 != (undefined4 *)0x0) {
          *in_stack_00000020 = 0;
        }
        local_58 = 0;
        for (local_50 = 0; local_50 < 9; local_50 = local_50 + 1) {
          local_108[local_50] = 1;
          local_158[local_50] = 1;
          local_1a8[local_50] = 1;
          alStack_228[local_50] = 1;
        }
        for (local_50 = 0; local_50 < (int)local_30; local_50 = local_50 + 1) {
          if (*(long *)(local_48 + local_50 * 8) < *(long *)(local_40 + local_50 * 8)) {
            snprintf(local_328,0x51,"ffgsvui: illegal range specified for axis %ld",local_50 + 1);
            ffpmsg((char *)0x1b804d);
            *in_stack_00000028 = 0x141;
            return 0x141;
          }
          local_108[local_50] = *(long *)(local_40 + local_50 * 8);
          local_158[local_50] = *(long *)(local_48 + local_50 * 8);
          local_1a8[local_50] = *(long *)(&in_stack_00000008->HDUposition + local_50 * 2);
          alStack_228[local_50 + 1] = alStack_228[local_50] * local_38[local_50];
        }
        if ((local_30 == 1) && (*local_38 == 1)) {
          local_1b0 = (local_b0 - local_a8) / local_b8;
          local_1c0 = local_b8;
          local_b0 = local_a8;
        }
        else {
          local_1b0 = (local_158[0] - local_108[0]) / *(long *)in_stack_00000008;
          local_1c0 = local_1a8[0];
        }
        local_1b0 = local_1b0 + 1;
        for (local_a0 = local_a8; local_a0 <= local_b0; local_a0 = local_b8 + local_a0) {
          for (local_98 = local_108[8]; local_98 <= local_158[8]; local_98 = local_1a8[8] + local_98
              ) {
            for (local_90 = local_108[7]; local_90 <= local_158[7];
                local_90 = local_1a8[7] + local_90) {
              for (local_88 = local_108[6]; local_88 <= local_158[6];
                  local_88 = local_1a8[6] + local_88) {
                for (local_80 = local_108[5]; local_80 <= local_158[5];
                    local_80 = local_1a8[5] + local_80) {
                  for (local_78 = local_108[4]; local_78 <= local_158[4];
                      local_78 = local_1a8[4] + local_78) {
                    for (local_70 = local_108[3]; local_70 <= local_158[3];
                        local_70 = local_1a8[3] + local_70) {
                      for (local_68 = local_108[2]; local_68 <= local_158[2];
                          local_68 = local_1a8[2] + local_68) {
                        for (local_60 = local_108[1]; local_60 <= local_158[1];
                            local_60 = local_1a8[1] + local_60) {
                          local_1d0 = local_108[0] + (local_60 + -1) * alStack_228[1] +
                                      (local_68 + -1) * alStack_228[2] +
                                      (local_70 + -1) * alStack_228[3] +
                                      (local_78 + -1) * alStack_228[4] +
                                      (local_80 + -1) * alStack_228[5] +
                                      (local_88 + -1) * alStack_228[6] +
                                      (local_90 + -1) * alStack_228[7] +
                                      (local_98 + -1) * alStack_228[8];
                          iVar1 = ffgclui(in_stack_00006f78,in_stack_00006f74,in_stack_00006f68,
                                          in_stack_00006f60,in_stack_00006f58,in_stack_00006f50,
                                          in_stack_00006fc0,in_stack_00006fc8,in_stack_00006fd0,
                                          in_stack_00006fd8,in_stack_00006fe0,in_stack_00006fe8);
                          if (0 < iVar1) {
                            return *in_stack_00000028;
                          }
                          if ((local_2d0 != 0) && (in_stack_00000020 != (undefined4 *)0x0)) {
                            *in_stack_00000020 = 1;
                          }
                          local_58 = local_1b0 + local_58;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        iVar1 = *in_stack_00000028;
      }
      else {
        iVar1 = *in_stack_00000028;
      }
    }
    else {
      for (local_50 = 0; local_50 < (int)local_30; local_50 = local_50 + 1) {
        local_278[local_50] = *(undefined8 *)(local_40 + local_50 * 8);
        local_2c8[local_50] = *(undefined8 *)(local_48 + local_50 * 8);
      }
      fits_read_compressed_img
                (in_stack_00000008,unaff_retaddr,unaff_RBP,unaff_R14,unaff_RBX,
                 in_stack_ffffffffffffffe4,(void *)msg._0_8_,(void *)msg._8_8_,(char *)msg._16_8_,
                 (int *)msg._24_8_,(int *)msg._32_8_);
      iVar1 = *in_stack_00000028;
    }
  }
  return iVar1;
}

Assistant:

int ffgsvui(fitsfile *fptr, /* I - FITS file pointer                         */
           int  colnum,    /* I - number of the column to read (1 = 1st)    */
           int naxis,      /* I - number of dimensions in the FITS array    */
           long  *naxes,   /* I - size of each dimension                    */
           long  *blc,     /* I - 'bottom left corner' of the subsection    */
           long  *trc,     /* I - 'top right corner' of the subsection      */
           long  *inc,     /* I - increment to be applied in each dimension */
  unsigned short nulval,   /* I - value to set undefined pixels             */
  unsigned short *array,   /* O - array to be filled and returned           */
           int  *anynul,   /* O - set to 1 if any values are null; else 0   */
           int  *status)   /* IO - error status                             */
/*
  Read a subsection of data values from an image or a table column.
  This routine is set up to handle a maximum of nine dimensions.
*/
{
    long ii,i0, i1,i2,i3,i4,i5,i6,i7,i8,row,rstr,rstp,rinc;
    long str[9],stp[9],incr[9];
    long nelem, nultyp, ninc, numcol;
    LONGLONG felem, dsize[10], blcll[9], trcll[9];
    int hdutype, anyf;
    char ldummy, msg[FLEN_ERRMSG];
    int nullcheck = 1;
    unsigned short nullvalue;

    if (naxis < 1 || naxis > 9)
    {
        snprintf(msg, FLEN_ERRMSG,"NAXIS = %d in call to ffgsvui is out of range", naxis);
        ffpmsg(msg);
        return(*status = BAD_DIMEN);
    }

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        for (ii=0; ii < naxis; ii++) {
	    blcll[ii] = blc[ii];
	    trcll[ii] = trc[ii];
	}

        nullvalue = nulval;  /* set local variable */

        fits_read_compressed_img(fptr, TUSHORT, blcll, trcll, inc,
            nullcheck, &nullvalue, array, NULL, anynul, status);
        return(*status);
    }

/*
    if this is a primary array, then the input COLNUM parameter should
    be interpreted as the row number, and we will alway read the image
    data from column 2 (any group parameters are in column 1).
*/
    if (ffghdt(fptr, &hdutype, status) > 0)
        return(*status);

    if (hdutype == IMAGE_HDU)
    {
        /* this is a primary array, or image extension */
        if (colnum == 0)
        {
            rstr = 1;
            rstp = 1;
        }
        else
        {
            rstr = colnum;
            rstp = colnum;
        }
        rinc = 1;
        numcol = 2;
    }
    else
    {
        /* this is a table, so the row info is in the (naxis+1) elements */
        rstr = blc[naxis];
        rstp = trc[naxis];
        rinc = inc[naxis];
        numcol = colnum;
    }

    nultyp = 1;
    if (anynul)
        *anynul = FALSE;

    i0 = 0;
    for (ii = 0; ii < 9; ii++)
    {
        str[ii] = 1;
        stp[ii] = 1;
        incr[ii] = 1;
        dsize[ii] = 1;
    }

    for (ii = 0; ii < naxis; ii++)
    {
      if (trc[ii] < blc[ii])
      {
        snprintf(msg, FLEN_ERRMSG,"ffgsvui: illegal range specified for axis %ld", ii + 1);
        ffpmsg(msg);
        return(*status = BAD_PIX_NUM);
      }

      str[ii] = blc[ii];
      stp[ii] = trc[ii];
      incr[ii] = inc[ii];
      dsize[ii + 1] = dsize[ii] * naxes[ii];
    }

    if (naxis == 1 && naxes[0] == 1)
    {
      /* This is not a vector column, so read all the rows at once */
      nelem = (rstp - rstr) / rinc + 1;
      ninc = rinc;
      rstp = rstr;
    }
    else
    {
      /* have to read each row individually, in all dimensions */
      nelem = (stp[0] - str[0]) / inc[0] + 1;
      ninc = incr[0];
    }

    for (row = rstr; row <= rstp; row += rinc)
    {
     for (i8 = str[8]; i8 <= stp[8]; i8 += incr[8])
     {
      for (i7 = str[7]; i7 <= stp[7]; i7 += incr[7])
      {
       for (i6 = str[6]; i6 <= stp[6]; i6 += incr[6])
       {
        for (i5 = str[5]; i5 <= stp[5]; i5 += incr[5])
        {
         for (i4 = str[4]; i4 <= stp[4]; i4 += incr[4])
         {
          for (i3 = str[3]; i3 <= stp[3]; i3 += incr[3])
          {
           for (i2 = str[2]; i2 <= stp[2]; i2 += incr[2])
           {
            for (i1 = str[1]; i1 <= stp[1]; i1 += incr[1])
            {
              felem=str[0] + (i1 - 1) * dsize[1] + (i2 - 1) * dsize[2] + 
                             (i3 - 1) * dsize[3] + (i4 - 1) * dsize[4] +
                             (i5 - 1) * dsize[5] + (i6 - 1) * dsize[6] +
                             (i7 - 1) * dsize[7] + (i8 - 1) * dsize[8];
              if ( ffgclui(fptr, numcol, row, felem, nelem, ninc, nultyp,
                   nulval, &array[i0], &ldummy, &anyf, status) > 0)
                   return(*status);

              if (anyf && anynul)
                  *anynul = TRUE;

              i0 += nelem;
            }
           }
          }
         }
        }
       }
      }
     }
    }
    return(*status);
}